

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O3

StandardFileCommon *
chatra::emb::io::StandardFileSystem::doOpenFile(string *fileName,Type_conflict flags)

{
  size_type sVar1;
  int *piVar2;
  FILE *pFVar3;
  size_t sVar4;
  StandardFileCommon *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  IllegalArgumentException *this;
  undefined8 *puVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  size_type local_88;
  undefined8 uStack_80;
  string local_78;
  string local_58;
  Type_conflict local_34;
  
  if ((~flags & 6) == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pFVar3 = fopen((fileName->_M_dataplus)._M_p,"r+b");
    if ((pFVar3 == (FILE *)0x0) &&
       ((*piVar2 != 2 || (pFVar3 = fopen((fileName->_M_dataplus)._M_p,"wb"), pFVar3 == (FILE *)0x0))
       )) {
      this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      IllegalArgumentException::IllegalArgumentException
                (this,"cannot open file: %s",(fileName->_M_dataplus)._M_p);
      __cxa_throw(this,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
    }
    local_34 = flags;
    sVar4 = getFileLengthOrClose((string *)(fileName->_M_dataplus)._M_p,(FILE *)pFVar3);
    pSVar5 = (StandardFileCommon *)operator_new(0x48);
    local_78._M_dataplus._M_p = (fileName->_M_dataplus)._M_p;
    paVar6 = &fileName->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar6) {
      local_78.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&fileName->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_78._M_string_length = fileName->_M_string_length;
    (fileName->_M_dataplus)._M_p = (pointer)paVar6;
    fileName->_M_string_length = 0;
    (fileName->field_2)._M_local_buf[0] = '\0';
    WriteStandardFile::WriteStandardFile
              ((WriteStandardFile *)pSVar5,&local_78,local_34,(FILE *)pFVar3,sVar4,true);
    _Var9._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return pSVar5;
    }
  }
  else {
    if ((flags & 2) == 0) {
      if ((flags & 1) != 0) {
        pFVar3 = fopen((fileName->_M_dataplus)._M_p,"rb");
        sVar4 = getFileLengthOrClose((string *)(fileName->_M_dataplus)._M_p,(FILE *)pFVar3);
        pSVar5 = (StandardFileCommon *)operator_new(0x48);
        psVar8 = (size_type *)(fileName->_M_dataplus)._M_p;
        paVar6 = &fileName->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8 == paVar6) {
          local_88 = paVar6->_M_allocated_capacity;
          uStack_80 = *(undefined8 *)((long)&fileName->field_2 + 8);
          psVar8 = &local_88;
        }
        else {
          local_88 = paVar6->_M_allocated_capacity;
        }
        sVar1 = fileName->_M_string_length;
        (fileName->_M_dataplus)._M_p = (pointer)paVar6;
        fileName->_M_string_length = 0;
        (fileName->field_2)._M_local_buf[0] = '\0';
        (pSVar5->super_IFile)._vptr_IFile = (_func_int **)&PTR__StandardFileCommon_00247c98;
        paVar6 = &(pSVar5->fileName).field_2;
        (pSVar5->fileName)._M_dataplus._M_p = (pointer)paVar6;
        if (psVar8 == &local_88) {
          paVar6->_M_allocated_capacity = local_88;
          *(undefined8 *)((long)&(pSVar5->fileName).field_2 + 8) = uStack_80;
        }
        else {
          (pSVar5->fileName)._M_dataplus._M_p = (pointer)psVar8;
          (pSVar5->fileName).field_2._M_allocated_capacity = local_88;
        }
        (pSVar5->fileName)._M_string_length = sVar1;
        pSVar5->flags = flags;
        pSVar5->fp = (FILE *)pFVar3;
        pSVar5->length = sVar4;
        pSVar5->current = 0;
        (pSVar5->super_IFile)._vptr_IFile = (_func_int **)&PTR__StandardFileCommon_00247cf0;
        return pSVar5;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
      puVar7[2] = 0;
      puVar7[3] = 0;
      puVar7[4] = 0;
      puVar7[1] = puVar7 + 3;
      *(undefined1 *)(puVar7 + 3) = 0;
      *puVar7 = &PTR__NativeException_00242de8;
      __cxa_throw(puVar7,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
    }
    pFVar3 = fopen((fileName->_M_dataplus)._M_p,"wb");
    pSVar5 = (StandardFileCommon *)operator_new(0x48);
    local_58._M_dataplus._M_p = (fileName->_M_dataplus)._M_p;
    paVar6 = &fileName->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar6) {
      local_58.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_58.field_2._8_8_ = *(undefined8 *)((long)&fileName->field_2 + 8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_58._M_string_length = fileName->_M_string_length;
    (fileName->_M_dataplus)._M_p = (pointer)paVar6;
    fileName->_M_string_length = 0;
    (fileName->field_2)._M_local_buf[0] = '\0';
    WriteStandardFile::WriteStandardFile
              ((WriteStandardFile *)pSVar5,&local_58,flags,(FILE *)pFVar3,0,false);
    _Var9._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return pSVar5;
    }
  }
  operator_delete(_Var9._M_p);
  return pSVar5;
}

Assistant:

static StandardFileCommon *doOpenFile(std::string fileName, FileOpenFlags::Type flags) {
		if ((flags & FileOpenFlags::Write) && (flags & FileOpenFlags::Append)) {
			errno = 0;
			auto fp = std::fopen(fileName.data(), "r+b");
			if (fp == nullptr && errno == ENOENT)
				fp = std::fopen(fileName.data(), "wb");
			if (fp == nullptr)
				throw IllegalArgumentException("cannot open file: %s", fileName.data());

			size_t length = getFileLengthOrClose(fileName, fp);
			return new WriteStandardFile(std::move(fileName), flags, fp, length, true);
		}
		else if (flags & FileOpenFlags::Write) {
			auto fp = std::fopen(fileName.data(), "wb");
			return new WriteStandardFile(std::move(fileName), flags, fp, 0, false);
		}
		else if (flags & FileOpenFlags::Read) {
			auto fp = std::fopen(fileName.data(), "rb");
			size_t length = getFileLengthOrClose(fileName, fp);
			return new ReadStandardFile(std::move(fileName), flags, fp, length);
		}
		else
			throw IllegalArgumentException();
	}